

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zealot.c
# Opt level: O2

void burning_vision_tick(CHAR_DATA *ch,AFFECT_DATA *af)

{
  bool bVar1;
  int iVar2;
  AFFECT_DATA *pAVar3;
  
  iVar2 = get_bv_stage(ch);
  if (3 < iVar2) {
    bVar1 = is_affected_by(ch,0);
    if (!bVar1) {
      act("You are blinded!",ch,(void *)0x0,(void *)0x0,3);
      act("$n appears to be blinded.",ch,(void *)0x0,(void *)0x0,0);
      pAVar3 = (AFFECT_DATA *)&ch->affected;
      do {
        pAVar3 = pAVar3->next;
        if (pAVar3 == (AFFECT_DATA *)0x0) break;
      } while (pAVar3->type != gsn_burning_vision);
      *(byte *)pAVar3->bitvector = (byte)pAVar3->bitvector[0] | 1;
      *(byte *)ch->affected_by = (byte)ch->affected_by[0] | 1;
    }
  }
  return;
}

Assistant:

void burning_vision_tick(CHAR_DATA *ch, AFFECT_DATA *af)
{
	AFFECT_DATA *caf;

	if (get_bv_stage(ch) >= 4 && !is_affected_by(ch, AFF_BLIND))
	{
		act("You are blinded!", ch, 0, 0, TO_CHAR);
		act("$n appears to be blinded.", ch, 0, 0, TO_ROOM);

		for (caf = ch->affected; caf != nullptr; caf = caf->next)
		{
			if (caf->type == gsn_burning_vision)
				break;
		}

		SET_BIT(caf->bitvector, AFF_BLIND);
		SET_BIT(ch->affected_by, AFF_BLIND);
	}
}